

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void reap_child_handler(int sig)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  do {
    _Var2 = waitpid(-1,(int *)0x0,1);
  } while (0 < _Var2);
  *piVar3 = iVar1;
  if (fio_old_sig_chld.__sigaction_handler.sa_handler < (__sighandler_t)0x2) {
    return;
  }
  (*fio_old_sig_chld.__sigaction_handler.sa_handler)(sig);
  return;
}

Assistant:

static void reap_child_handler(int sig) {
  (void)(sig);
  int old_errno = errno;
  while (waitpid(-1, NULL, WNOHANG) > 0)
    ;
  errno = old_errno;
  if (fio_old_sig_chld.sa_handler != SIG_IGN &&
      fio_old_sig_chld.sa_handler != SIG_DFL)
    fio_old_sig_chld.sa_handler(sig);
}